

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesStop(Fra_Cla_t *p)

{
  Vec_Int_t *__ptr;
  
  if (p->pMemClasses != (Aig_Obj_t **)0x0) {
    free(p->pMemClasses);
    p->pMemClasses = (Aig_Obj_t **)0x0;
  }
  if (p->pMemRepr != (Aig_Obj_t **)0x0) {
    free(p->pMemRepr);
    p->pMemRepr = (Aig_Obj_t **)0x0;
  }
  if (p->vClassesTemp != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassesTemp);
  }
  if (p->vClassNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassNew);
  }
  if (p->vClassOld != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassOld);
  }
  if (p->vClasses1 != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClasses1);
  }
  if (p->vClasses != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClasses);
  }
  __ptr = p->vImps;
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    free(__ptr);
  }
  free(p);
  return;
}

Assistant:

void Fra_ClassesStop( Fra_Cla_t * p )
{
    ABC_FREE( p->pMemClasses );
    ABC_FREE( p->pMemRepr );
    if ( p->vClassesTemp ) Vec_PtrFree( p->vClassesTemp );
    if ( p->vClassNew )    Vec_PtrFree( p->vClassNew );
    if ( p->vClassOld )    Vec_PtrFree( p->vClassOld );
    if ( p->vClasses1 )    Vec_PtrFree( p->vClasses1 );
    if ( p->vClasses )     Vec_PtrFree( p->vClasses );
    if ( p->vImps )        Vec_IntFree( p->vImps );
    ABC_FREE( p );
}